

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_async_function_call
                  (JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,int flags
                  )

{
  list_head *plVar1;
  JSRuntime *pJVar2;
  list_head *plVar3;
  int iVar4;
  JSAsyncFunctionData *s;
  ulong uVar5;
  ulong uVar6;
  JSValue JVar8;
  int64_t iVar7;
  
  s = (JSAsyncFunctionData *)js_mallocz(ctx,0xa8);
  if (s != (JSAsyncFunctionData *)0x0) {
    (s->header).ref_count = 1;
    pJVar2 = ctx->rt;
    (s->header).field_0x4 = 4;
    plVar1 = &(s->header).link;
    plVar3 = (pJVar2->gc_obj_list).prev;
    plVar3->next = plVar1;
    (s->header).link.prev = plVar3;
    (s->header).link.next = &pJVar2->gc_obj_list;
    (pJVar2->gc_obj_list).prev = plVar1;
    s->is_active = 0;
    s->resolving_funcs[0].u.int32 = 0;
    s->resolving_funcs[0].tag = 3;
    s->resolving_funcs[1].u.int32 = 0;
    s->resolving_funcs[1].tag = 3;
    JVar8 = JS_NewPromiseCapability(ctx,s->resolving_funcs);
    iVar7 = JVar8.tag;
    if ((int)JVar8.tag != 6) {
      iVar4 = async_func_init(ctx,&s->func_state,func_obj,this_obj,argc,argv);
      if (iVar4 == 0) {
        s->is_active = 1;
        js_async_function_resume(ctx,s);
        js_async_function_free(ctx->rt,s);
        uVar6 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
        uVar5 = (ulong)JVar8.u.ptr & 0xffffffff;
        goto LAB_0012af81;
      }
    }
    JS_FreeValue(ctx,JVar8);
    js_async_function_free(ctx->rt,s);
  }
  uVar5 = 0;
  uVar6 = 0;
  iVar7 = 6;
LAB_0012af81:
  JVar8.u.ptr = (void *)(uVar5 | uVar6);
  JVar8.tag = iVar7;
  return JVar8;
}

Assistant:

static JSValue js_async_function_call(JSContext *ctx, JSValueConst func_obj,
                                      JSValueConst this_obj,
                                      int argc, JSValueConst *argv, int flags)
{
    JSValue promise;
    JSAsyncFunctionData *s;

    s = js_mallocz(ctx, sizeof(*s));
    if (!s)
        return JS_EXCEPTION;
    s->header.ref_count = 1;
    add_gc_object(ctx->rt, &s->header, JS_GC_OBJ_TYPE_ASYNC_FUNCTION);
    s->is_active = FALSE;
    s->resolving_funcs[0] = JS_UNDEFINED;
    s->resolving_funcs[1] = JS_UNDEFINED;

    promise = JS_NewPromiseCapability(ctx, s->resolving_funcs);
    if (JS_IsException(promise))
        goto fail;

    if (async_func_init(ctx, &s->func_state, func_obj, this_obj, argc, argv)) {
    fail:
        JS_FreeValue(ctx, promise);
        js_async_function_free(ctx->rt, s);
        return JS_EXCEPTION;
    }
    s->is_active = TRUE;

    js_async_function_resume(ctx, s);

    js_async_function_free(ctx->rt, s);

    return promise;
}